

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void fieldsel(LexState *ls,expdesc *v)

{
  undefined1 local_58 [8];
  expdesc key;
  FuncState *fs;
  expdesc *v_local;
  LexState *ls_local;
  
  key._48_8_ = ls->fs;
  memset(local_58,0,0x38);
  key.t = -1;
  key.usertype._0_4_ = 0xffffffff;
  luaK_exp2anyregup((FuncState *)key._48_8_,v);
  luaX_next(ls);
  checkname(ls,(expdesc *)local_58);
  luaK_indexed((FuncState *)key._48_8_,v,(expdesc *)local_58);
  return;
}

Assistant:

static void fieldsel (LexState *ls, expdesc *v) {
  /* fieldsel -> ['.' | ':'] NAME */
  FuncState *fs = ls->fs;
  expdesc key = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  luaK_exp2anyregup(fs, v);
  luaX_next(ls);  /* skip the dot or colon */
  checkname(ls, &key);
  luaK_indexed(fs, v, &key);
}